

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

void A_Weave(AActor *self,int xyspeed,int zspeed,double xydist,double zdist)

{
  byte bVar1;
  BYTE BVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar11;
  double dStack_90;
  double dStack_80;
  DVector2 local_68;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  bVar1 = self->WeaveIndexZ;
  if ((xyspeed != 0) && ((xydist != 0.0 || (NAN(xydist))))) {
    BVar2 = self->WeaveIndexXY;
    dVar5 = FFastTrig::sin(&fasttrig,xydist);
    dVar5 = dVar5 * 8.0 * xydist;
    dVar7 = (self->__Pos).X;
    dVar8 = (self->__Pos).Y;
    dVar6 = FFastTrig::cos(&fasttrig,dVar7);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_8_ = dVar6;
    local_58._12_4_ = extraout_XMM0_Dd;
    dVar6 = FFastTrig::sin(&fasttrig,dVar6);
    dVar7 = dVar7 - (double)local_58._0_8_ * dVar5;
    dVar8 = dVar8 - dVar6 * dVar5;
    auVar3._8_4_ = SUB84(dVar8,0);
    auVar3._0_8_ = dVar7;
    auVar3._12_4_ = (int)((ulong)dVar8 >> 0x20);
    dVar5 = FFastTrig::sin(&fasttrig,dVar7);
    dVar5 = dVar5 * 8.0 * xydist;
    dVar6 = FFastTrig::cos(&fasttrig,dVar5);
    dVar8 = FFastTrig::sin(&fasttrig,dVar6);
    dVar7 = dVar5 * dVar6 + dVar7;
    dStack_80 = auVar3._8_8_;
    dStack_80 = dVar5 * dVar8 + dStack_80;
    uVar10 = SUB84(dStack_80,0);
    uVar11 = (undefined4)((ulong)dStack_80 >> 0x20);
    auVar4._8_4_ = uVar10;
    auVar4._0_8_ = dVar7;
    auVar4._12_4_ = uVar11;
    local_68.Y._0_4_ = uVar10;
    local_68.X = dVar7;
    local_68.Y._4_4_ = uVar11;
    if (((self->flags5).Value & 0x200000) == 0) {
      P_TryMove(self,&local_68,1,(secplane_t *)0x0);
    }
    else {
      AActor::UnlinkFromWorld(self);
      *(byte *)&(self->flags).Value = (byte)(self->flags).Value | 0x10;
      dVar5 = (self->__Pos).X;
      dVar6 = (self->__Pos).Y;
      dStack_90 = auVar4._8_8_;
      local_68.X = dVar7 - dVar5;
      local_68.Y = dStack_90 - dVar6;
      P_GetOffsetPosition(dVar5,dVar6,local_68.X,local_68.Y);
      (self->__Pos).X = local_48;
      (self->__Pos).Y = dStack_40;
      AActor::LinkToWorld(self,false,(sector_t *)0x0);
    }
    self->WeaveIndexXY = (char)xyspeed + BVar2 & 0x3f;
  }
  if ((zspeed != 0) && ((zdist != 0.0 || (NAN(zdist))))) {
    dVar5 = FFastTrig::sin(&fasttrig,
                           (double)(bVar1 & 0x3f) * 5.625 * 11930464.711111112 + 6755399441055744.0)
    ;
    (self->__Pos).Z = (self->__Pos).Z - dVar5 * 8.0 * zdist;
    uVar9 = zspeed + (uint)bVar1 & 0x3f;
    dVar5 = FFastTrig::sin(&fasttrig,(double)uVar9 * 5.625 * 11930464.711111112 + 6755399441055744.0
                          );
    (self->__Pos).Z = dVar5 * 8.0 * zdist + (self->__Pos).Z;
    self->WeaveIndexZ = (BYTE)uVar9;
  }
  return;
}

Assistant:

void A_Weave(AActor *self, int xyspeed, int zspeed, double xydist, double zdist)
{
	DVector2 newpos;
	int weaveXY, weaveZ;
	DAngle angle;
	double dist;

	weaveXY = self->WeaveIndexXY & 63;
	weaveZ = self->WeaveIndexZ & 63;
	angle = self->Angles.Yaw + 90;

	if (xydist != 0 && xyspeed != 0)
	{
		dist = BobSin(weaveXY) * xydist;
		newpos = self->Pos().XY() - angle.ToVector(dist);
		weaveXY = (weaveXY + xyspeed) & 63;
		dist = BobSin(weaveXY) * xydist;
		newpos += angle.ToVector(dist);
		if (!(self->flags5 & MF5_NOINTERACTION))
		{
			P_TryMove (self, newpos, true);
		}
		else
		{
			self->UnlinkFromWorld ();
			self->flags |= MF_NOBLOCKMAP;
			// We need to do portal offsetting here explicitly, because SetXY cannot do that.
			newpos -= self->Pos().XY();
			self->SetXY(self->Vec2Offset(newpos.X, newpos.Y));
			self->LinkToWorld ();
		}
		self->WeaveIndexXY = weaveXY;
	}
	if (zdist != 0 && zspeed != 0)
	{
		self->AddZ(-BobSin(weaveZ) * zdist);
		weaveZ = (weaveZ + zspeed) & 63;
		self->AddZ(BobSin(weaveZ) * zdist);
		self->WeaveIndexZ = weaveZ;
	}
}